

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O1

void KYBER_decap(uint8_t *out_shared_secret,uint8_t *ciphertext,KYBER_private_key *private_key)

{
  uint16_t uVar1;
  int i;
  int iVar2;
  long lVar3;
  int i_1;
  long lVar4;
  byte bVar5;
  uint uVar6;
  scalar *out;
  uint16_t *out_00;
  int i_3;
  bool bVar7;
  uint8_t decrypted [64];
  uint8_t prekey_and_randomness [64];
  uint8_t input [64];
  uint8_t expected_ciphertext [1088];
  byte local_a68 [32];
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  uint16_t local_a28 [16];
  uint8_t local_a08 [480];
  scalar local_828;
  vector local_628;
  
  out = local_628.v;
  vector_decode((vector *)out,ciphertext,10);
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar6 = (uint)((scalar *)out->c)->c[lVar4] * 0xd01;
      ((scalar *)out->c)->c[lVar4] = (short)(uVar6 >> 10) + (ushort)((uVar6 >> 9 & 1) != 0);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
    lVar3 = lVar3 + 1;
    out = out + 1;
  } while (lVar3 != 3);
  vector_ntt(&local_628);
  out_00 = local_a28;
  scalar_decode((scalar *)out_00,ciphertext + 0x3c0,4);
  lVar3 = 0;
  do {
    local_a28[lVar3] =
         (short)((uint)local_a28[lVar3] * 0xd01 >> 4) +
         (ushort)(((uint)local_a28[lVar3] * 0xd01 >> 3 & 1) != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  scalar_inner_product(&local_828,(vector *)((long)&private_key->opaque + 0x1840),&local_628);
  scalar_inverse_ntt(&local_828);
  lVar3 = 0;
  do {
    uVar1 = reduce_once((local_a28[lVar3] - local_828.c[lVar3]) + 0xd01);
    local_a28[lVar3] = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  scalar_compress((scalar *)out_00,1);
  lVar3 = 0;
  do {
    lVar4 = 0;
    bVar5 = 0;
    do {
      bVar5 = bVar5 | (byte)((out_00[lVar4] & 1) << ((byte)lVar4 & 0x1f));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    local_a68[lVar3] = bVar5;
    out_00 = out_00 + 8;
    bVar7 = lVar3 != 0x1f;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  local_a48 = *(undefined8 *)((long)&private_key->opaque + 0x620);
  uStack_a40 = *(undefined8 *)((long)&private_key->opaque + 0x628);
  local_a38 = *(undefined8 *)((long)&private_key->opaque + 0x630);
  uStack_a30 = *(undefined8 *)((long)&private_key->opaque + 0x638);
  BORINGSSL_keccak((uint8_t *)local_a28,0x40,local_a68,0x40,boringssl_sha3_512);
  encrypt_cpa((uint8_t *)&local_628,(public_key *)private_key,local_a68,local_a08);
  iVar2 = CRYPTO_memcmp(ciphertext,&local_628,0x440);
  lVar3 = 0;
  bVar5 = 0xff;
  if (iVar2 != 0) {
    bVar5 = 0;
  }
  do {
    *(byte *)((long)local_828.c + lVar3) =
         (private_key->opaque).bytes[lVar3 + 0x1e40] & ~bVar5 |
         *(byte *)((long)local_a28 + lVar3) & bVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  BORINGSSL_keccak((uint8_t *)(local_828.c + 0x10),0x20,ciphertext,0x440,boringssl_sha3_256);
  BORINGSSL_keccak(out_shared_secret,0x20,(uint8_t *)&local_828,0x40,boringssl_shake256);
  return;
}

Assistant:

void KYBER_decap(uint8_t out_shared_secret[KYBER_SHARED_SECRET_BYTES],
                 const uint8_t ciphertext[KYBER_CIPHERTEXT_BYTES],
                 const struct KYBER_private_key *private_key) {
  const struct private_key *priv = private_key_from_external(private_key);
  uint8_t decrypted[64];
  decrypt_cpa(decrypted, priv, ciphertext);
  OPENSSL_memcpy(decrypted + 32, priv->pub.public_key_hash,
                 sizeof(decrypted) - 32);
  uint8_t prekey_and_randomness[64];
  hash_g(prekey_and_randomness, decrypted, sizeof(decrypted));
  uint8_t expected_ciphertext[KYBER_CIPHERTEXT_BYTES];
  encrypt_cpa(expected_ciphertext, &priv->pub, decrypted,
              prekey_and_randomness + 32);
  uint8_t mask =
      constant_time_eq_int_8(CRYPTO_memcmp(ciphertext, expected_ciphertext,
                                           sizeof(expected_ciphertext)),
                             0);
  uint8_t input[64];
  for (int i = 0; i < 32; i++) {
    input[i] = constant_time_select_8(mask, prekey_and_randomness[i],
                                      priv->fo_failure_secret[i]);
  }
  hash_h(input + 32, ciphertext, KYBER_CIPHERTEXT_BYTES);
  kdf(out_shared_secret, KYBER_SHARED_SECRET_BYTES, input, sizeof(input));
}